

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int ReadInt32(unqlite_file *pFd,sxu32 *pOut,sxi64 iOfft)

{
  uchar local_2c [4];
  int rc;
  uchar zBuf [4];
  sxi64 iOfft_local;
  sxu32 *pOut_local;
  unqlite_file *pFd_local;
  
  _rc = iOfft;
  pFd_local._4_4_ = unqliteOsRead(pFd,local_2c,4,iOfft);
  if (pFd_local._4_4_ == 0) {
    SyBigEndianUnpack32(local_2c,pOut);
    pFd_local._4_4_ = 0;
  }
  return pFd_local._4_4_;
}

Assistant:

static int ReadInt32(unqlite_file *pFd,sxu32 *pOut,sxi64 iOfft)
{
	unsigned char zBuf[4];
	int rc;
	rc = unqliteOsRead(pFd,zBuf,sizeof(zBuf),iOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	SyBigEndianUnpack32(zBuf,pOut);
	return UNQLITE_OK;
}